

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::anon_unknown_0::FirstGroup::init(FirstGroup *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  DrawTest *this_00;
  long lVar1;
  int *value;
  int firsts [3];
  string desc;
  string name;
  DrawTestSpec spec;
  allocator<char> local_111;
  int local_110 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  string local_c0;
  string local_a0;
  DrawTestSpec local_80;
  
  local_110[0] = 1;
  local_110[1] = 3;
  local_110[2] = 0x11;
  deqp::gls::DrawTestSpec::DrawTestSpec(&local_80);
  genBasicSpec(&local_80,this->m_method);
  for (lVar1 = 0; lVar1 != 0xc; lVar1 = lVar1 + 4) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_100,"first_",(allocator<char> *)&local_a0);
    value = (int *)((long)local_110 + lVar1);
    de::toString<int>(&local_c0,value);
    std::operator+(&local_e0,&local_100,&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_c0,"first ",&local_111);
    de::toString<int>(&local_a0,value);
    std::operator+(&local_100,&local_c0,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::__cxx11::string::~string((string *)&local_c0);
    this_00 = (DrawTest *)operator_new(0x138);
    deqp::gls::DrawTest::DrawTest
              (this_00,(this->super_TestCaseGroup).super_TestCaseGroup.super_TestNode.m_testCtx,
               ((this->super_TestCaseGroup).m_context)->m_renderCtx,local_e0._M_dataplus._M_p,
               local_100._M_dataplus._M_p);
    local_80.first = *value;
    addTestIterations(this_00,&local_80,TYPE_DRAW_COUNT);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_e0);
  }
  std::
  _Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
  ::~_Vector_base(&local_80.attribs.
                   super__Vector_base<deqp::gls::DrawTestSpec::AttributeSpec,_std::allocator<deqp::gls::DrawTestSpec::AttributeSpec>_>
                 );
  return extraout_EAX;
}

Assistant:

void FirstGroup::init (void)
{
	const int firsts[] =
	{
		1, 3, 17
	};

	gls::DrawTestSpec spec;
	genBasicSpec(spec, m_method);

	for (int firstNdx = 0; firstNdx < DE_LENGTH_OF_ARRAY(firsts); ++firstNdx)
	{
		const std::string	name = std::string("first_") + de::toString(firsts[firstNdx]);
		const std::string	desc = std::string("first ") + de::toString(firsts[firstNdx]);
		gls::DrawTest*		test = new gls::DrawTest(m_testCtx, m_context.getRenderContext(), name.c_str(), desc.c_str());

		spec.first = firsts[firstNdx];

		addTestIterations(test, spec, TYPE_DRAW_COUNT);

		this->addChild(test);
	}
}